

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::XMLPrinter(XMLPrinter *this,FILE *file,bool compact,int depth)

{
  int local_34;
  int iStack_30;
  char entityValue;
  int i_1;
  int i;
  int depth_local;
  bool compact_local;
  FILE *file_local;
  XMLPrinter *this_local;
  
  XMLVisitor::XMLVisitor(&this->super_XMLVisitor);
  (this->super_XMLVisitor)._vptr_XMLVisitor = (_func_int **)&PTR__XMLPrinter_00395890;
  this->_elementJustOpened = false;
  DynArray<const_char_*,_10>::DynArray(&this->_stack);
  this->_firstElement = true;
  this->_fp = file;
  this->_depth = depth;
  this->_textDepth = -1;
  this->_processEntities = true;
  this->_compactMode = compact;
  DynArray<char,_20>::DynArray(&this->_buffer);
  for (iStack_30 = 0; iStack_30 < 0x40; iStack_30 = iStack_30 + 1) {
    this->_entityFlag[iStack_30] = false;
    this->_restrictedEntityFlag[iStack_30] = false;
  }
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    this->_entityFlag[(byte)entities[(long)local_34 * 0x10 + 0xc]] = true;
  }
  this->_restrictedEntityFlag[0x26] = true;
  this->_restrictedEntityFlag[0x3c] = true;
  this->_restrictedEntityFlag[0x3e] = true;
  DynArray<char,_20>::Push(&this->_buffer,'\0');
  return;
}

Assistant:

XMLPrinter::XMLPrinter( FILE* file, bool compact, int depth ) :
    _elementJustOpened( false ),
    _firstElement( true ),
    _fp( file ),
    _depth( depth ),
    _textDepth( -1 ),
    _processEntities( true ),
    _compactMode( compact )
{
    for( int i=0; i<ENTITY_RANGE; ++i ) {
        _entityFlag[i] = false;
        _restrictedEntityFlag[i] = false;
    }
    for( int i=0; i<NUM_ENTITIES; ++i ) {
        const char entityValue = entities[i].value;
        TIXMLASSERT( 0 <= entityValue && entityValue < ENTITY_RANGE );
        _entityFlag[ (unsigned char)entityValue ] = true;
    }
    _restrictedEntityFlag[(unsigned char)'&'] = true;
    _restrictedEntityFlag[(unsigned char)'<'] = true;
    _restrictedEntityFlag[(unsigned char)'>'] = true;	// not required, but consistency is nice
    _buffer.Push( 0 );
}